

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Label __thiscall asmjit::Assembler::newLabel(Assembler *this)

{
  uint in_EAX;
  Error error;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  CodeEmitter *in_RSI;
  Label LVar1;
  uint32_t id;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (in_RSI->_lastError == 0) {
    if (in_RSI->_code == (CodeHolder *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/assembler.cpp"
                 ,0xab,"_code != nullptr");
    }
    error = CodeHolder::newLabelId(in_RSI->_code,(uint32_t *)((long)&uStack_18 + 4));
    in_RDX = extraout_RDX;
    if (error != 0) {
      CodeEmitter::setLastError(in_RSI,error,(char *)0x0);
      in_RDX = extraout_RDX_00;
    }
  }
  (this->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)(uStack_18 & 0xffffffff00000000 | 4);
  (this->super_CodeEmitter)._codeInfo._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->super_CodeEmitter)._codeInfo.field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  LVar1.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)in_RDX;
  LVar1.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)this;
  return (Label)LVar1.super_Operand.super_Operand_.field_0;
}

Assistant:

Label Assembler::newLabel() {
  uint32_t id = 0;
  if (!_lastError) {
    ASMJIT_ASSERT(_code != nullptr);
    Error err = _code->newLabelId(id);
    if (ASMJIT_UNLIKELY(err)) setLastError(err);
  }
  return Label(id);
}